

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O0

plain_range_sorted<int>
partition_binary<plain_range_sorted<int>,int>(plain_range_sorted<int> range,int value)

{
  plain_range<int> pVar1;
  bool bVar2;
  uint uVar3;
  int *piVar4;
  int in_EDX;
  int __c;
  int *in_RSI;
  int *in_RDI;
  long in_FS_OFFSET;
  plain_range_sorted<int> pVar5;
  uint pivot;
  uint in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int *local_48;
  int *local_40;
  int *local_38;
  int *local_30;
  plain_range<int> local_28;
  int *local_18;
  int *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.begin = in_RDI;
  local_28.end = in_RSI;
  concept_empty::check<plain_range_sorted<int>>((plain_range_sorted<int> *)&local_28);
  concept_index::check<plain_range_sorted<int>>((plain_range_sorted<int> *)&local_28);
  concept_size::check<plain_range_sorted<int>>((plain_range_sorted<int> *)&local_28);
  concept_slice::check<plain_range_sorted<int>>((plain_range_sorted<int> *)&local_28);
  concept_sorted::check<plain_range_sorted<int>>((plain_range_sorted<int> *)&local_28);
  bVar2 = plain_range<int>::empty(&local_28);
  if (bVar2) {
    local_18 = local_28.begin;
    local_10 = local_28.end;
  }
  else {
    piVar4 = plain_range<int>::back
                       ((plain_range<int> *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if (*piVar4 < in_EDX) {
      plain_range_sorted<int>::plain_range_sorted((plain_range_sorted<int> *)0x24da9b);
    }
    else {
      while (uVar3 = plain_range<int>::size(&local_28), 1 < uVar3) {
        uVar3 = plain_range<int>::size(&local_28);
        uVar3 = uVar3 - 1 >> 1;
        piVar4 = (int *)plain_range<int>::index(&local_28,(char *)(ulong)uVar3,__c);
        if (*piVar4 < in_EDX) {
          in_stack_ffffffffffffffac = uVar3 + 1;
          plain_range<int>::size(&local_28);
          pVar5 = plain_range_sorted<int>::slice
                            ((plain_range_sorted<int> *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                             in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
          local_38 = pVar5.super_plain_range<int>.begin;
          local_28.begin = local_38;
          local_30 = pVar5.super_plain_range<int>.end;
          local_28.end = local_30;
        }
        else {
          pVar5 = plain_range_sorted<int>::slice
                            ((plain_range_sorted<int> *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                             in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
          local_48 = pVar5.super_plain_range<int>.begin;
          local_28.begin = local_48;
          local_40 = pVar5.super_plain_range<int>.end;
          local_28.end = local_40;
        }
      }
      local_18 = local_28.begin;
      local_10 = local_28.end;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  pVar1.end._0_4_ = (int)local_10;
  pVar1.begin = local_18;
  pVar1.end._4_4_ = (int)((ulong)local_10 >> 0x20);
  return (plain_range_sorted<int>)pVar1;
}

Assistant:

R partition_binary(R range, T value)
{
	concept_empty::check(range);
	concept_index::check(range);
	concept_size::check(range);
	concept_slice::check(range);
	concept_sorted::check(range);

	if(range.empty())
		return range;
	if(range.back() < value)
		return R();

	while(range.size() > 1)
	{
		unsigned pivot = (range.size()-1)/2;
		if(range.index(pivot) < value)
			range = range.slice(pivot+1, range.size()-1);
		else
			range = range.slice(0, pivot+1);
	}
	return range;
}